

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QTime QTime::fromString(QString *string,QStringView format)

{
  long lVar1;
  bool bVar2;
  undefined8 in_RDX;
  int baseYear;
  void *pvVar3;
  long in_FS_OFFSET;
  QDateTimeParser dt;
  QTime time;
  QStringView in_stack_00000280;
  QLocale *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 uVar4;
  undefined8 in_stack_ffffffffffffff28;
  QDateTimeParser *in_stack_ffffffffffffff30;
  QCalendar in_stack_ffffffffffffff38;
  QDate *in_stack_ffffffffffffff40;
  QString *t;
  QDateTimeParser *this;
  undefined4 in_stack_fffffffffffffff0;
  QTime QVar5;
  
  baseYear = (int)((ulong)in_RDX >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QVar5.mds = -0x55555556;
  QTime((QTime *)&stack0xfffffffffffffff4);
  t = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  this = (QDateTimeParser *)&DAT_aaaaaaaaaaaaaaaa;
  QCalendar::QCalendar((QCalendar *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  pvVar3 = (void *)0xf;
  QDateTimeParser::QDateTimeParser
            (in_stack_ffffffffffffff30,(Type)((ulong)in_stack_ffffffffffffff28 >> 0x20),
             (Context)in_stack_ffffffffffffff28,in_stack_ffffffffffffff38);
  QLocale::c(&stack0xffffffffffffff38,pvVar3);
  QDateTimeParser::setDefaultLocale
            ((QDateTimeParser *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffee8);
  QLocale::~QLocale((QLocale *)0x56cb10);
  bVar2 = QDateTimeParser::parseFormat
                    ((QDateTimeParser *)CONCAT44(QVar5.mds,in_stack_fffffffffffffff0),
                     in_stack_00000280);
  uVar4 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffef4);
  if (bVar2) {
    QDateTimeParser::fromString
              (this,t,in_stack_ffffffffffffff40,(QTime *)in_stack_ffffffffffffff38.d_ptr,baseYear);
  }
  QDateTimeParser::~QDateTimeParser((QDateTimeParser *)CONCAT44(uVar4,in_stack_fffffffffffffef0));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QTime)QVar5.mds;
}

Assistant:

QTime QTime::fromString(const QString &string, QStringView format)
{
    QTime time;
#if QT_CONFIG(datetimeparser)
    QDateTimeParser dt(QMetaType::QTime, QDateTimeParser::FromString, QCalendar());
    dt.setDefaultLocale(QLocale::c());
    if (dt.parseFormat(format))
        dt.fromString(string, nullptr, &time);
#else
    Q_UNUSED(string);
    Q_UNUSED(format);
#endif
    return time;
}